

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O2

void __thiscall FTextureShader::Update(FTextureShader *this,int framems)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  
  uVar1 = this->lastUpdate;
  if (uVar1 != 0) {
    for (uVar2 = 0; uVar2 < (this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Count;
        uVar2 = uVar2 + 1) {
      FShaderLayer::Update
                ((this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Array[uVar2],
                 (float)(framems - uVar1) * 0.001);
    }
  }
  this->lastUpdate = framems;
  return;
}

Assistant:

void FTextureShader::Update(int framems)
{
	float diff = (framems - lastUpdate) / 1000.f;

	if (lastUpdate != 0) // && !paused && !bglobal.freeze)
	{
		for (unsigned int i = 0; i < layers.Size(); i++)
		{
			layers[i]->Update(diff);
		}
	}
	lastUpdate = framems;
}